

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void __thiscall amrex::expect::expect(expect *this,char c)

{
  (this->istr)._M_dataplus._M_p = (pointer)&(this->istr).field_2;
  (this->istr)._M_string_length = 0;
  (this->istr).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)this);
  return;
}

Assistant:

amrex::expect::expect(char c)
{
    istr += c;
}